

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O2

void image_32_filter_99_case(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  bool *pbVar7;
  float fVar8;
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  int local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  iVar2 = layer->height;
  iVar13 = layer->filter_size;
  iVar3 = iimage->data_width;
  pfVar5 = iimage->data;
  iVar4 = layer->step;
  lVar24 = (long)iVar4;
  iVar10 = (iVar13 + -1) / 2;
  uVar11 = iVar13 / 3;
  pfVar6 = layer->response;
  fVar26 = 1.0 / (float)(iVar13 * iVar13);
  pbVar7 = layer->laplacian;
  local_58 = iimage->width + -1;
  fVar1 = pfVar5[((long)iimage->height + -1) * (long)iVar3 + -1 + (long)iimage->width];
  iVar21 = layer->width * iVar4;
  uVar12 = iVar13 / 6;
  iVar25 = -iVar10;
  iVar20 = 0;
  iVar13 = -uVar12;
  for (lVar18 = 0; lVar18 < (int)(iVar21 - uVar12); lVar18 = lVar18 + lVar24) {
    iVar15 = (int)lVar18;
    auVar9 = vfmadd132ss_fma(ZEXT416((uint)pfVar5[(int)((uVar11 + ~uVar12 + iVar15) * iVar3 +
                                                       local_58)]),ZEXT416((uint)fVar1),
                             ZEXT416(0xc0400000));
    iVar22 = (uVar11 - 1) + iVar15;
    fVar8 = auVar9._0_4_ * fVar26;
    iVar16 = ~uVar11 + iVar15;
    lVar17 = 0;
    for (iVar19 = -1; iVar23 = iVar19 + 1, iVar23 < iVar21; iVar19 = iVar4 + iVar19) {
      iVar14 = uVar11 + 1 + iVar19;
      fVar27 = box_integral_unconditional_opt
                         (iimage,iVar15 - uVar11,iVar25 + iVar19,iVar22,iVar10 + 1 + iVar19);
      auVar32._0_4_ =
           box_integral_unconditional_opt
                     (iimage,iVar15 - uVar11,iVar13 + iVar19,iVar22,(uVar11 - uVar12) + iVar19);
      auVar32._4_60_ = extraout_var;
      auVar9 = vfmadd132ss_fma(auVar32._0_16_,ZEXT416((uint)fVar27),ZEXT416(0xc0400000));
      fVar28 = box_integral_unconditional_opt(iimage,iVar16,iVar23,iVar15 + -1,iVar14);
      fVar29 = box_integral_unconditional_opt(iimage,iVar15,iVar19 - uVar11,uVar11 + iVar15,iVar19);
      fVar30 = box_integral_unconditional_opt(iimage,iVar16,iVar19 - uVar11,iVar15 + -1,iVar19);
      fVar31 = box_integral_unconditional_opt(iimage,iVar15,iVar23,uVar11 + iVar15,iVar14);
      fVar27 = fVar26 * auVar9._0_4_;
      fVar28 = fVar26 * (((fVar29 + fVar28) - fVar30) - fVar31);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28 * -0.81)),ZEXT416((uint)fVar27),
                               ZEXT416((uint)fVar8));
      pfVar6[iVar20 + lVar17] = auVar9._0_4_;
      pbVar7[lVar17 + iVar20] = 0.0 <= fVar8 + fVar27;
      lVar17 = lVar17 + 1;
    }
    iVar20 = iVar20 + (int)lVar17;
  }
  fVar1 = fVar1 * -2.0;
  fVar8 = fVar1 * fVar26;
  for (; iVar16 = (int)lVar18, iVar16 <= (int)uVar12; lVar18 = lVar18 + lVar24) {
    iVar19 = iVar16 - uVar11;
    iVar15 = iVar16 + -1 + uVar11;
    lVar17 = 0;
    for (iVar22 = -1; iVar23 = iVar22 + 1, iVar23 < iVar21; iVar22 = iVar4 + iVar22) {
      iVar14 = uVar11 + 1 + iVar22;
      fVar27 = box_integral_unconditional_opt
                         (iimage,iVar19,iVar25 + iVar22,iVar15,iVar10 + 1 + iVar22);
      auVar33._0_4_ =
           box_integral_unconditional_opt
                     (iimage,iVar19,iVar13 + iVar22,iVar15,(uVar11 - uVar12) + iVar22);
      auVar33._4_60_ = extraout_var_00;
      auVar9 = vfmadd132ss_fma(auVar33._0_16_,ZEXT416((uint)fVar27),ZEXT416(0xc0400000));
      fVar28 = box_integral_unconditional_opt(iimage,iVar19 + -1,iVar23,iVar16 + -1,iVar14);
      fVar29 = box_integral_unconditional_opt(iimage,iVar16,iVar22 - uVar11,iVar16 + uVar11,iVar22);
      fVar30 = box_integral_unconditional_opt(iimage,iVar19 + -1,iVar22 - uVar11,iVar16 + -1,iVar22)
      ;
      fVar31 = box_integral_unconditional_opt(iimage,iVar16,iVar23,iVar16 + uVar11,iVar14);
      fVar27 = fVar26 * auVar9._0_4_;
      fVar28 = fVar26 * (((fVar29 + fVar28) - fVar30) - fVar31);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28 * -0.81)),ZEXT416((uint)fVar27),
                               ZEXT416((uint)fVar8));
      pfVar6[iVar20 + lVar17] = auVar9._0_4_;
      pbVar7[lVar17 + iVar20] = 0.0 <= fVar8 + fVar27;
      lVar17 = lVar17 + 1;
    }
    iVar20 = iVar20 + (int)lVar17;
  }
  for (; lVar18 < iVar2 * lVar24; lVar18 = lVar18 + lVar24) {
    iVar15 = (int)lVar18;
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[(int)((~uVar12 + iVar15) * iVar3 + local_58)]),
                             SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar1));
    iVar19 = (uVar11 - 1) + iVar15;
    fVar8 = auVar9._0_4_ * fVar26;
    iVar16 = ~uVar11 + iVar15;
    lVar17 = 0;
    for (iVar22 = -1; iVar23 = iVar22 + 1, iVar23 < iVar21; iVar22 = iVar4 + iVar22) {
      iVar14 = uVar11 + 1 + iVar22;
      fVar27 = box_integral_unconditional_opt
                         (iimage,iVar15 - uVar11,iVar25 + iVar22,iVar19,iVar10 + 1 + iVar22);
      auVar34._0_4_ =
           box_integral_unconditional_opt
                     (iimage,iVar15 - uVar11,iVar13 + iVar22,iVar19,(uVar11 - uVar12) + iVar22);
      auVar34._4_60_ = extraout_var_01;
      auVar9 = vfmadd132ss_fma(auVar34._0_16_,ZEXT416((uint)fVar27),ZEXT416(0xc0400000));
      fVar28 = box_integral_unconditional_opt(iimage,iVar16,iVar23,iVar15 + -1,iVar14);
      fVar29 = box_integral_unconditional_opt(iimage,iVar15,iVar22 - uVar11,uVar11 + iVar15,iVar22);
      fVar30 = box_integral_unconditional_opt(iimage,iVar16,iVar22 - uVar11,iVar15 + -1,iVar22);
      fVar31 = box_integral_unconditional_opt(iimage,iVar15,iVar23,uVar11 + iVar15,iVar14);
      fVar27 = fVar26 * auVar9._0_4_;
      fVar28 = fVar26 * (((fVar29 + fVar28) - fVar30) - fVar31);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28 * -0.81)),ZEXT416((uint)fVar27),
                               ZEXT416((uint)fVar8));
      pfVar6[iVar20 + lVar17] = auVar9._0_4_;
      pbVar7[lVar17 + iVar20] = 0.0 <= fVar8 + fVar27;
      lVar17 = lVar17 + 1;
    }
    iVar20 = iVar20 + (int)lVar17;
  }
  return;
}

Assistant:

inline void image_32_filter_99_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // Case 2.2a the filter is longer and wider than the image.

    // D is right bottom corner or to the right (possibly below image)
    // A, B, C = 0
    D0 = data[(iheight-1) * data_width + (iwidth-1)];


    // We divide it again in 3 parts.
    // 1. B outside, D inside
    // 2. B outside, D outside
    // 3. B inside, D outside

    // 1. Case: B outside, D inside
    for (x = 0; x < width*step-lobe/2; x += step) {
        // negative part
        r10 = x - lobe / 2 - 1;
        r11 = r10 + lobe;  // TODO: fix this

        D1 = data[r11 * data_width + (iwidth-1)];

        // Compute Dyy
        Dyy = D0 - 3 * D1;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 2. Case: B outside, D outside
    Dyy = - 2 * D0;
    Dyy *= inv_area;

    for (; x < lobe/2+1; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width*step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 3. Case: B inside, D outside
    for (; x < height * step; x += step) {
        r10 = x - lobe / 2 - 1;

        B = data[r10 * data_width + (iwidth-1)];
        // D1 = D0 - B;
        // Dyy = D0 - 3 * D1;
        // Dyy *= inv_area;

        // this can be simplified to:
        // (small difference in original is this but error is <0.000001 eps)
        Dyy = 3*B - 2*D0;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }
}